

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_add_signed_Test::TestBody(correctness_add_signed_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  big_integer local_130;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_e0;
  Message local_d8;
  big_integer local_d0;
  big_integer local_b0;
  big_integer local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  undefined1 local_50 [8];
  big_integer b;
  big_integer a;
  correctness_add_signed_Test *this_local;
  
  big_integer::big_integer((big_integer *)&b.sign,5);
  big_integer::big_integer((big_integer *)local_50,-0x14);
  big_integer::big_integer(&local_b0,(big_integer *)&b.sign);
  operator+(&local_90,&local_b0,(big_integer *)local_50);
  big_integer::big_integer(&local_d0,-0xf);
  bVar1 = ::operator==(&local_90,&local_d0);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_70,bVar1);
  big_integer::~big_integer(&local_d0);
  big_integer::~big_integer(&local_90);
  big_integer::~big_integer(&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_70,
               (AssertionResult *)"a + b == -15","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  big_integer::operator+=((big_integer *)&b.sign,(big_integer *)local_50);
  big_integer::big_integer(&local_130,-0xf);
  bVar1 = ::operator==((big_integer *)&b.sign,&local_130);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_110,bVar1);
  big_integer::~big_integer(&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_160,(internal *)local_110,(AssertionResult *)"a == -15","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  big_integer::~big_integer((big_integer *)local_50);
  big_integer::~big_integer((big_integer *)&b.sign);
  return;
}

Assistant:

TEST(correctness, add_signed) {
    big_integer a = 5;
    big_integer b = -20;

    EXPECT_TRUE(a + b == -15);

    a += b;
    EXPECT_TRUE(a == -15);
}